

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::UniformCase::assignUniforms
          (UniformCase *this,
          vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,deUint32 programGL,Random *rnd)

{
  allocator<float> *this_00;
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  int iVar4;
  bool bVar5;
  GLint location_00;
  int iVar6;
  GLenum GVar7;
  deBool dVar8;
  TestLog *this_01;
  size_type sVar9;
  const_reference str;
  MessageBuilder *pMVar10;
  GLchar *name;
  char *name_00;
  pointer pBVar11;
  reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  reference pvVar15;
  VarValue *value;
  VarValue *value_00;
  bool transpose_00;
  bool local_845;
  int local_818;
  int local_814;
  int local_810;
  int local_80c;
  DataType local_804;
  float local_7f4;
  int local_7f0;
  GLint unit;
  int i_4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> buffer_3;
  deUint32 *ptr_2;
  int i_3;
  vector<int,_std::allocator<int>_> buffer_2;
  deInt32 *ptr_1;
  int i_2;
  vector<float,_std::allocator<float>_> buffer_1;
  int i_1;
  vector<float,_std::allocator<float>_> buffer;
  float *ptr;
  string local_710;
  MessageBuilder local_6f0;
  string local_570;
  char *local_550;
  MessageBuilder local_548;
  VarValue local_3c8;
  undefined1 local_384 [8];
  VarValue apiValue;
  __normal_iterator<const_deqp::gles31::Functional::UniformCase::BasicUniform_*,_std::vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>_>
  local_338;
  const_iterator elemUnif;
  VarValue unifValue;
  string local_2e0;
  byte local_2ba;
  byte local_2b9;
  string local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [8];
  string curName;
  undefined1 local_230 [4];
  int i;
  vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
  valuesToAssign;
  bool assignByValue;
  int typeSize;
  int location;
  MessageBuilder local_1f8;
  int local_74;
  undefined1 local_70 [4];
  int numValuesToAssign;
  string queryName;
  bool isArrayMember;
  BasicUniform *uniform;
  int unifNdx;
  DataType boolApiType;
  GLboolean transposeGL;
  bool transpose;
  TestLog *log;
  Random *rnd_local;
  deUint32 programGL_local;
  vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
  *basicUniforms_local;
  UniformCase *this_local;
  
  this_01 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  transpose_00 = (*(uint *)&(this->super_CallLogWrapper).field_0x14 & 4) != 0;
  if ((*(uint *)&(this->super_CallLogWrapper).field_0x14 & 0x40) == 0) {
    local_804 = TYPE_FLOAT;
    if ((*(uint *)&(this->super_CallLogWrapper).field_0x14 & 0x80) != 0) {
      local_804 = TYPE_UINT;
    }
  }
  else {
    local_804 = TYPE_INT;
  }
  uniform._4_4_ = 0;
  do {
    sVar9 = std::
            vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
            ::size(basicUniforms);
    if ((int)sVar9 <= uniform._4_4_) {
      return;
    }
    str = std::
          vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
          ::operator[](basicUniforms,(long)uniform._4_4_);
    queryName.field_2._M_local_buf[0xf] = -1 < str->elemNdx;
    if (((*(uint *)&(this->super_CallLogWrapper).field_0x14 & 0x100) == 0) || (str->elemNdx != 0)) {
      std::__cxx11::string::string((string *)local_70,(string *)str);
    }
    else {
      beforeLast((string *)local_70,&str->name,'[');
    }
    if ((queryName.field_2._M_local_buf[0xf] & 1U) == 0) {
      local_80c = 1;
    }
    else {
      if ((*(uint *)&(this->super_CallLogWrapper).field_0x14 & 8) == 0) {
        if ((*(uint *)&(this->super_CallLogWrapper).field_0x14 & 0x10) == 0) {
          local_818 = 1;
        }
        else {
          local_818 = 0;
          if (str->elemNdx % 2 == 0) {
            local_818 = 2;
          }
        }
        local_814 = local_818;
      }
      else {
        if (str->elemNdx == 0) {
          local_810 = str->rootSize;
        }
        else {
          local_810 = 0;
        }
        local_814 = local_810;
      }
      local_80c = local_814;
    }
    local_74 = local_80c;
    if (local_80c == 0) {
      tcu::TestLog::operator<<(&local_1f8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar10 = tcu::MessageBuilder::operator<<(&local_1f8,(char (*) [12])"// Uniform ");
      pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&str->name);
      pMVar10 = tcu::MessageBuilder::operator<<
                          (pMVar10,(char (*) [67])
                                   " is covered by another glProgramUniform*v() call to the same array"
                          );
      tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1f8);
    }
    else {
      name = (GLchar *)std::__cxx11::string::c_str();
      location_00 = glu::CallLogWrapper::glGetUniformLocation
                              (&this->super_CallLogWrapper,programGL,name);
      iVar6 = glu::getDataTypeScalarSize(str->type);
      local_845 = false;
      if ((*(uint *)&(this->super_CallLogWrapper).field_0x14 & 2) != 0) {
        bVar5 = glu::isDataTypeMatrix(str->type);
        local_845 = false;
        if (!bVar5) {
          local_845 = local_74 == 1;
        }
      }
      valuesToAssign.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_845;
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
      ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                *)local_230);
      for (curName.field_2._12_4_ = 0; (int)curName.field_2._12_4_ < local_74;
          curName.field_2._12_4_ = curName.field_2._12_4_ + 1) {
        local_2b9 = 0;
        local_2ba = 0;
        unifValue.val._59_1_ = 0;
        unifValue.val._58_1_ = 0;
        if ((queryName.field_2._M_local_buf[0xf] & 1U) == 0) {
          std::__cxx11::string::string((string *)local_258,(string *)str);
        }
        else {
          beforeLast(&local_2b8,&str->rootName,'[');
          local_2b9 = 1;
          std::operator+(&local_298,&local_2b8,"[");
          local_2ba = 1;
          unifValue.val.floatV[0xf] = (float)(str->elemNdx + curName.field_2._12_4_);
          de::toString<int>(&local_2e0,unifValue.val.intV + 0xf);
          unifValue.val._59_1_ = 1;
          std::operator+(&local_278,&local_298,&local_2e0);
          unifValue.val._58_1_ = 1;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_258,&local_278,"]");
        }
        if ((unifValue.val._58_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_278);
        }
        if ((unifValue.val._59_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_2e0);
        }
        if ((local_2ba & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_298);
        }
        if ((local_2b9 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_2b8);
        }
        if ((queryName.field_2._M_local_buf[0xf] & 1U) == 0) {
          memcpy((void *)((long)&elemUnif._M_current + 4),&str->finalValue,0x44);
LAB_0222b05f:
          bVar5 = glu::isDataTypeBoolOrBVec(elemUnif._M_current._4_4_);
          if (bVar5) {
            getRandomBoolRepresentation
                      ((VarValue *)local_384,(VarValue *)((long)&elemUnif._M_current + 4),local_804,
                       rnd);
          }
          else {
            bVar5 = glu::isDataTypeSampler(elemUnif._M_current._4_4_);
            if (bVar5) {
              getSamplerUnitValue((VarValue *)local_384,(VarValue *)((long)&elemUnif._M_current + 4)
                                 );
            }
            else {
              memcpy(local_384,(void *)((long)&elemUnif._M_current + 4),0x44);
            }
          }
          bVar5 = glu::isDataTypeMatrix(local_384._0_4_);
          if ((bVar5) && (transpose_00)) {
            getTransposeMatrix(&local_3c8,(VarValue *)local_384);
          }
          else {
            memcpy(&local_3c8,local_384,0x44);
          }
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
          ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                       *)local_230,&local_3c8);
          bVar5 = glu::isDataTypeBoolOrBVec(str->type);
          if (bVar5) {
            tcu::TestLog::operator<<(&local_548,this_01,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar10 = tcu::MessageBuilder::operator<<(&local_548,(char (*) [15])"// Using type ");
            local_550 = glu::getDataTypeName(local_804);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_550);
            pMVar10 = tcu::MessageBuilder::operator<<
                                (pMVar10,(char (*) [23])" to set boolean value ");
            apiVarValueStr_abi_cxx11_
                      (&local_570,(Functional *)((long)&elemUnif._M_current + 4),value);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_570);
            pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [6])0x2a79e9c);
            pMVar10 = tcu::MessageBuilder::operator<<
                                (pMVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_258);
            tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::string::~string((string *)&local_570);
            tcu::MessageBuilder::~MessageBuilder(&local_548);
          }
          else {
            bVar5 = glu::isDataTypeSampler(str->type);
            if (bVar5) {
              tcu::TestLog::operator<<
                        (&local_6f0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar10 = tcu::MessageBuilder::operator<<
                                  (&local_6f0,(char (*) [36])"// Texture for the sampler uniform ");
              pMVar10 = tcu::MessageBuilder::operator<<
                                  (pMVar10,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_258);
              pMVar10 = tcu::MessageBuilder::operator<<
                                  (pMVar10,(char (*) [28])" will be filled with color ");
              getSamplerFillValue((VarValue *)((long)&ptr + 4),&str->finalValue);
              apiVarValueStr_abi_cxx11_(&local_710,(Functional *)((long)&ptr + 4),value_00);
              pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_710);
              tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::string::~string((string *)&local_710);
              tcu::MessageBuilder::~MessageBuilder(&local_6f0);
            }
          }
        }
        else {
          name_00 = (char *)std::__cxx11::string::c_str();
          local_338._M_current = (BasicUniform *)BasicUniform::findWithName(basicUniforms,name_00);
          apiValue.val._56_8_ =
               std::
               vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>
               ::end(basicUniforms);
          bVar5 = __gnu_cxx::operator==
                            (&local_338,
                             (__normal_iterator<const_deqp::gles31::Functional::UniformCase::BasicUniform_*,_std::vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>_>
                              *)((long)&apiValue.val + 0x38));
          if (!bVar5) {
            pBVar11 = __gnu_cxx::
                      __normal_iterator<const_deqp::gles31::Functional::UniformCase::BasicUniform_*,_std::vector<deqp::gles31::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles31::Functional::UniformCase::BasicUniform>_>_>
                      ::operator->(&local_338);
            memcpy((void *)((long)&elemUnif._M_current + 4),&pBVar11->finalValue,0x44);
            goto LAB_0222b05f;
          }
        }
        std::__cxx11::string::~string((string *)local_258);
      }
      pvVar12 = std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_230,0);
      bVar5 = glu::isDataTypeFloatOrVec(pvVar12->type);
      if (bVar5) {
        if ((valuesToAssign.
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
          sVar9 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                  ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                          *)local_230);
          this_00 = (allocator<float> *)
                    ((long)&buffer_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 7);
          std::allocator<float>::allocator(this_00);
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&i_1,sVar9 * (long)iVar6,this_00);
          std::allocator<float>::~allocator
                    ((allocator<float> *)
                     ((long)&buffer_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 7));
          for (buffer_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
              iVar4 = (int)buffer_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
              sVar9 = std::vector<float,_std::allocator<float>_>::size
                                ((vector<float,_std::allocator<float>_> *)&i_1), iVar4 < (int)sVar9;
              buffer_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_ =
                   (int)buffer_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 1) {
            pvVar12 = std::
                      vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                      ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                    *)local_230,
                                   (long)((int)buffer_1.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage /
                                         iVar6));
            vVar1 = *(value_type *)
                     ((long)&pvVar12->val +
                     (long)((int)buffer_1.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage % iVar6) * 4);
            pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)&i_1,
                                 (long)(int)buffer_1.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage);
            *pvVar13 = vVar1;
          }
          switch(iVar6) {
          case 1:
            do {
              sVar9 = std::
                      vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                      ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_230);
              pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)&i_1,0);
              glu::CallLogWrapper::glProgramUniform1fv
                        (&this->super_CallLogWrapper,programGL,location_00,(GLsizei)sVar9,pvVar13);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,
                              "glProgramUniform1fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x59d);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
            break;
          case 2:
            do {
              sVar9 = std::
                      vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                      ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_230);
              pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)&i_1,0);
              glu::CallLogWrapper::glProgramUniform2fv
                        (&this->super_CallLogWrapper,programGL,location_00,(GLsizei)sVar9,pvVar13);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,
                              "glProgramUniform2fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x59e);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
            break;
          case 3:
            do {
              sVar9 = std::
                      vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                      ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_230);
              pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)&i_1,0);
              glu::CallLogWrapper::glProgramUniform3fv
                        (&this->super_CallLogWrapper,programGL,location_00,(GLsizei)sVar9,pvVar13);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,
                              "glProgramUniform3fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x59f);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
            break;
          case 4:
            do {
              sVar9 = std::
                      vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                      ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_230);
              pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)&i_1,0);
              glu::CallLogWrapper::glProgramUniform4fv
                        (&this->super_CallLogWrapper,programGL,location_00,(GLsizei)sVar9,pvVar13);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,
                              "glProgramUniform4fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x5a0);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
          }
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)&i_1);
        }
        else {
          pvVar12 = std::
                    vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                    ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                  *)local_230,0);
          buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)&pvVar12->val;
          switch(iVar6) {
          case 1:
            do {
              glu::CallLogWrapper::glProgramUniform1f
                        (&this->super_CallLogWrapper,programGL,location_00,
                         *buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,"glProgramUniform1f(programGL, location, ptr[0])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x58c);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
            break;
          case 2:
            do {
              glu::CallLogWrapper::glProgramUniform2f
                        (&this->super_CallLogWrapper,programGL,location_00,
                         *buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                         buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage[1]);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,"glProgramUniform2f(programGL, location, ptr[0], ptr[1])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x58d);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
            break;
          case 3:
            do {
              glu::CallLogWrapper::glProgramUniform3f
                        (&this->super_CallLogWrapper,programGL,location_00,
                         *buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                         buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage[1],
                         buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage[2]);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,
                              "glProgramUniform3f(programGL, location, ptr[0], ptr[1], ptr[2])",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x58e);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
            break;
          case 4:
            do {
              glu::CallLogWrapper::glProgramUniform4f
                        (&this->super_CallLogWrapper,programGL,location_00,
                         *buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                         buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage[1],
                         buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage[2],
                         buffer.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage[3]);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,
                              "glProgramUniform4f(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3])"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x58f);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
          }
        }
      }
      else {
        pvVar12 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                  ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                *)local_230,0);
        bVar5 = glu::isDataTypeMatrix(pvVar12->type);
        if (bVar5) {
          sVar9 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                  ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                          *)local_230);
          std::allocator<float>::allocator((allocator<float> *)((long)&ptr_1 + 7));
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&i_2,sVar9 * (long)iVar6,
                     (allocator<float> *)((long)&ptr_1 + 7));
          std::allocator<float>::~allocator((allocator<float> *)((long)&ptr_1 + 7));
          for (ptr_1._0_4_ = 0; iVar4 = (int)ptr_1,
              sVar9 = std::vector<float,_std::allocator<float>_>::size
                                ((vector<float,_std::allocator<float>_> *)&i_2), iVar4 < (int)sVar9;
              ptr_1._0_4_ = (int)ptr_1 + 1) {
            pvVar12 = std::
                      vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                      ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                    *)local_230,(long)((int)ptr_1 / iVar6));
            vVar1 = *(value_type *)((long)&pvVar12->val + (long)((int)ptr_1 % iVar6) * 4);
            pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)&i_2,(long)(int)ptr_1);
            *pvVar13 = vVar1;
          }
          switch(str->type) {
          case TYPE_FLOAT_MAT2:
            do {
              sVar9 = std::
                      vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                      ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_230);
              pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)&i_2,0);
              glu::CallLogWrapper::glProgramUniformMatrix2fv
                        (&this->super_CallLogWrapper,programGL,location_00,(GLsizei)sVar9,
                         transpose_00,pvVar13);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,
                              "glProgramUniformMatrix2fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x5b1);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
            break;
          case TYPE_FLOAT_MAT2X3:
            do {
              sVar9 = std::
                      vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                      ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_230);
              pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)&i_2,0);
              glu::CallLogWrapper::glProgramUniformMatrix2x3fv
                        (&this->super_CallLogWrapper,programGL,location_00,(GLsizei)sVar9,
                         transpose_00,pvVar13);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,
                              "glProgramUniformMatrix2x3fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x5b4);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
            break;
          case TYPE_FLOAT_MAT2X4:
            do {
              sVar9 = std::
                      vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                      ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_230);
              pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)&i_2,0);
              glu::CallLogWrapper::glProgramUniformMatrix2x4fv
                        (&this->super_CallLogWrapper,programGL,location_00,(GLsizei)sVar9,
                         transpose_00,pvVar13);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,
                              "glProgramUniformMatrix2x4fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x5b5);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
            break;
          case TYPE_FLOAT_MAT3X2:
            do {
              sVar9 = std::
                      vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                      ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_230);
              pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)&i_2,0);
              glu::CallLogWrapper::glProgramUniformMatrix3x2fv
                        (&this->super_CallLogWrapper,programGL,location_00,(GLsizei)sVar9,
                         transpose_00,pvVar13);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,
                              "glProgramUniformMatrix3x2fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x5b6);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
            break;
          case TYPE_FLOAT_MAT3:
            do {
              sVar9 = std::
                      vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                      ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_230);
              pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)&i_2,0);
              glu::CallLogWrapper::glProgramUniformMatrix3fv
                        (&this->super_CallLogWrapper,programGL,location_00,(GLsizei)sVar9,
                         transpose_00,pvVar13);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,
                              "glProgramUniformMatrix3fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x5b2);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
            break;
          case TYPE_FLOAT_MAT3X4:
            do {
              sVar9 = std::
                      vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                      ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_230);
              pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)&i_2,0);
              glu::CallLogWrapper::glProgramUniformMatrix3x4fv
                        (&this->super_CallLogWrapper,programGL,location_00,(GLsizei)sVar9,
                         transpose_00,pvVar13);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,
                              "glProgramUniformMatrix3x4fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x5b7);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
            break;
          case TYPE_FLOAT_MAT4X2:
            do {
              sVar9 = std::
                      vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                      ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_230);
              pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)&i_2,0);
              glu::CallLogWrapper::glProgramUniformMatrix4x2fv
                        (&this->super_CallLogWrapper,programGL,location_00,(GLsizei)sVar9,
                         transpose_00,pvVar13);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,
                              "glProgramUniformMatrix4x2fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x5b8);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
            break;
          case TYPE_FLOAT_MAT4X3:
            do {
              sVar9 = std::
                      vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                      ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_230);
              pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)&i_2,0);
              glu::CallLogWrapper::glProgramUniformMatrix4x3fv
                        (&this->super_CallLogWrapper,programGL,location_00,(GLsizei)sVar9,
                         transpose_00,pvVar13);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,
                              "glProgramUniformMatrix4x3fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x5b9);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
            break;
          case TYPE_FLOAT_MAT4:
            do {
              sVar9 = std::
                      vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                      ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_230);
              pvVar13 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)&i_2,0);
              glu::CallLogWrapper::glProgramUniformMatrix4fv
                        (&this->super_CallLogWrapper,programGL,location_00,(GLsizei)sVar9,
                         transpose_00,pvVar13);
              GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
              glu::checkError(GVar7,
                              "glProgramUniformMatrix4fv (programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                              ,0x5b3);
              dVar8 = ::deGetFalse();
            } while (dVar8 != 0);
          }
          std::vector<float,_std::allocator<float>_>::~vector
                    ((vector<float,_std::allocator<float>_> *)&i_2);
        }
        else {
          pvVar12 = std::
                    vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                    ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                  *)local_230,0);
          bVar5 = glu::isDataTypeIntOrIVec(pvVar12->type);
          if (bVar5) {
            if ((valuesToAssign.
                 super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
              sVar9 = std::
                      vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                      ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                              *)local_230);
              std::allocator<int>::allocator((allocator<int> *)((long)&ptr_2 + 7));
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&i_3,sVar9 * (long)iVar6,
                         (allocator<int> *)((long)&ptr_2 + 7));
              std::allocator<int>::~allocator((allocator<int> *)((long)&ptr_2 + 7));
              for (ptr_2._0_4_ = 0; iVar4 = (int)ptr_2,
                  sVar9 = std::vector<int,_std::allocator<int>_>::size
                                    ((vector<int,_std::allocator<int>_> *)&i_3), iVar4 < (int)sVar9;
                  ptr_2._0_4_ = (int)ptr_2 + 1) {
                pvVar12 = std::
                          vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                          ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                        *)local_230,(long)((int)ptr_2 / iVar6));
                vVar2 = *(value_type *)((long)&pvVar12->val + (long)((int)ptr_2 % iVar6) * 4);
                pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)&i_3,(long)(int)ptr_2);
                *pvVar14 = vVar2;
              }
              switch(iVar6) {
              case 1:
                do {
                  sVar9 = std::
                          vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                          ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                  *)local_230);
                  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)&i_3,0);
                  glu::CallLogWrapper::glProgramUniform1iv
                            (&this->super_CallLogWrapper,programGL,location_00,(GLsizei)sVar9,
                             pvVar14);
                  GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                  glu::checkError(GVar7,
                                  "glProgramUniform1iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                  ,0x5d7);
                  dVar8 = ::deGetFalse();
                } while (dVar8 != 0);
                break;
              case 2:
                do {
                  sVar9 = std::
                          vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                          ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                  *)local_230);
                  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)&i_3,0);
                  glu::CallLogWrapper::glProgramUniform2iv
                            (&this->super_CallLogWrapper,programGL,location_00,(GLsizei)sVar9,
                             pvVar14);
                  GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                  glu::checkError(GVar7,
                                  "glProgramUniform2iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                  ,0x5d8);
                  dVar8 = ::deGetFalse();
                } while (dVar8 != 0);
                break;
              case 3:
                do {
                  sVar9 = std::
                          vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                          ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                  *)local_230);
                  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)&i_3,0);
                  glu::CallLogWrapper::glProgramUniform3iv
                            (&this->super_CallLogWrapper,programGL,location_00,(GLsizei)sVar9,
                             pvVar14);
                  GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                  glu::checkError(GVar7,
                                  "glProgramUniform3iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                  ,0x5d9);
                  dVar8 = ::deGetFalse();
                } while (dVar8 != 0);
                break;
              case 4:
                do {
                  sVar9 = std::
                          vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                          ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                  *)local_230);
                  pvVar14 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)&i_3,0);
                  glu::CallLogWrapper::glProgramUniform4iv
                            (&this->super_CallLogWrapper,programGL,location_00,(GLsizei)sVar9,
                             pvVar14);
                  GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                  glu::checkError(GVar7,
                                  "glProgramUniform4iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                  ,0x5da);
                  dVar8 = ::deGetFalse();
                } while (dVar8 != 0);
              }
              std::vector<int,_std::allocator<int>_>::~vector
                        ((vector<int,_std::allocator<int>_> *)&i_3);
            }
            else {
              pvVar12 = std::
                        vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                        ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                      *)local_230,0);
              buffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage = (pointer)&pvVar12->val;
              switch(iVar6) {
              case 1:
                do {
                  glu::CallLogWrapper::glProgramUniform1i
                            (&this->super_CallLogWrapper,programGL,location_00,
                             *buffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
                  GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                  glu::checkError(GVar7,"glProgramUniform1i(programGL, location, ptr[0])",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                  ,0x5c6);
                  dVar8 = ::deGetFalse();
                } while (dVar8 != 0);
                break;
              case 2:
                do {
                  glu::CallLogWrapper::glProgramUniform2i
                            (&this->super_CallLogWrapper,programGL,location_00,
                             *buffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                             buffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage[1]);
                  GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                  glu::checkError(GVar7,"glProgramUniform2i(programGL, location, ptr[0], ptr[1])",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                  ,0x5c7);
                  dVar8 = ::deGetFalse();
                } while (dVar8 != 0);
                break;
              case 3:
                do {
                  glu::CallLogWrapper::glProgramUniform3i
                            (&this->super_CallLogWrapper,programGL,location_00,
                             *buffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                             buffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage[1],
                             buffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage[2]);
                  GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                  glu::checkError(GVar7,
                                  "glProgramUniform3i(programGL, location, ptr[0], ptr[1], ptr[2])",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                  ,0x5c8);
                  dVar8 = ::deGetFalse();
                } while (dVar8 != 0);
                break;
              case 4:
                do {
                  glu::CallLogWrapper::glProgramUniform4i
                            (&this->super_CallLogWrapper,programGL,location_00,
                             *buffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                             buffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage[1],
                             buffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage[2],
                             buffer_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage[3]);
                  GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                  glu::checkError(GVar7,
                                  "glProgramUniform4i(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3])"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                  ,0x5c9);
                  dVar8 = ::deGetFalse();
                } while (dVar8 != 0);
              }
            }
          }
          else {
            pvVar12 = std::
                      vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                      ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                    *)local_230,0);
            bVar5 = glu::isDataTypeUintOrUVec(pvVar12->type);
            if (bVar5) {
              if ((valuesToAssign.
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
                sVar9 = std::
                        vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                        ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                *)local_230);
                std::allocator<unsigned_int>::allocator
                          ((allocator<unsigned_int> *)((long)&unit + 3));
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_4,
                           sVar9 * (long)iVar6,(allocator<unsigned_int> *)((long)&unit + 3));
                std::allocator<unsigned_int>::~allocator
                          ((allocator<unsigned_int> *)((long)&unit + 3));
                for (local_7f0 = 0; iVar4 = local_7f0,
                    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_4),
                    iVar4 < (int)sVar9; local_7f0 = local_7f0 + 1) {
                  pvVar12 = std::
                            vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                            ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                          *)local_230,(long)(local_7f0 / iVar6));
                  vVar3 = *(value_type *)((long)&pvVar12->val + (long)(local_7f0 % iVar6) * 4);
                  pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_4,
                                       (long)local_7f0);
                  *pvVar15 = vVar3;
                }
                switch(iVar6) {
                case 1:
                  do {
                    sVar9 = std::
                            vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                            ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                    *)local_230);
                    pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_4
                                         ,0);
                    glu::CallLogWrapper::glProgramUniform1uiv
                              (&this->super_CallLogWrapper,programGL,location_00,(GLsizei)sVar9,
                               pvVar15);
                    GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                    glu::checkError(GVar7,
                                    "glProgramUniform1uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                    ,0x5f9);
                    dVar8 = ::deGetFalse();
                  } while (dVar8 != 0);
                  break;
                case 2:
                  do {
                    sVar9 = std::
                            vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                            ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                    *)local_230);
                    pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_4
                                         ,0);
                    glu::CallLogWrapper::glProgramUniform2uiv
                              (&this->super_CallLogWrapper,programGL,location_00,(GLsizei)sVar9,
                               pvVar15);
                    GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                    glu::checkError(GVar7,
                                    "glProgramUniform2uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                    ,0x5fa);
                    dVar8 = ::deGetFalse();
                  } while (dVar8 != 0);
                  break;
                case 3:
                  do {
                    sVar9 = std::
                            vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                            ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                    *)local_230);
                    pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_4
                                         ,0);
                    glu::CallLogWrapper::glProgramUniform3uiv
                              (&this->super_CallLogWrapper,programGL,location_00,(GLsizei)sVar9,
                               pvVar15);
                    GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                    glu::checkError(GVar7,
                                    "glProgramUniform3uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                    ,0x5fb);
                    dVar8 = ::deGetFalse();
                  } while (dVar8 != 0);
                  break;
                case 4:
                  do {
                    sVar9 = std::
                            vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                            ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                    *)local_230);
                    pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_4
                                         ,0);
                    glu::CallLogWrapper::glProgramUniform4uiv
                              (&this->super_CallLogWrapper,programGL,location_00,(GLsizei)sVar9,
                               pvVar15);
                    GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                    glu::checkError(GVar7,
                                    "glProgramUniform4uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                    ,0x5fc);
                    dVar8 = ::deGetFalse();
                  } while (dVar8 != 0);
                }
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_4);
              }
              else {
                pvVar12 = std::
                          vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                          ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                        *)local_230,0);
                buffer_3.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)&pvVar12->val;
                switch(iVar6) {
                case 1:
                  do {
                    glu::CallLogWrapper::glProgramUniform1ui
                              (&this->super_CallLogWrapper,programGL,location_00,
                               *buffer_3.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
                    GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                    glu::checkError(GVar7,"glProgramUniform1ui(programGL, location, ptr[0])",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                    ,0x5e8);
                    dVar8 = ::deGetFalse();
                  } while (dVar8 != 0);
                  break;
                case 2:
                  do {
                    glu::CallLogWrapper::glProgramUniform2ui
                              (&this->super_CallLogWrapper,programGL,location_00,
                               *buffer_3.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               buffer_3.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage[1]);
                    GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                    glu::checkError(GVar7,"glProgramUniform2ui(programGL, location, ptr[0], ptr[1])"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                    ,0x5e9);
                    dVar8 = ::deGetFalse();
                  } while (dVar8 != 0);
                  break;
                case 3:
                  do {
                    glu::CallLogWrapper::glProgramUniform3ui
                              (&this->super_CallLogWrapper,programGL,location_00,
                               *buffer_3.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               buffer_3.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage[1],
                               buffer_3.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage[2]);
                    GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                    glu::checkError(GVar7,
                                    "glProgramUniform3ui(programGL, location, ptr[0], ptr[1], ptr[2])"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                    ,0x5ea);
                    dVar8 = ::deGetFalse();
                  } while (dVar8 != 0);
                  break;
                case 4:
                  do {
                    glu::CallLogWrapper::glProgramUniform4ui
                              (&this->super_CallLogWrapper,programGL,location_00,
                               *buffer_3.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                               buffer_3.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage[1],
                               buffer_3.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage[2],
                               buffer_3.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage[3]);
                    GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                    glu::checkError(GVar7,
                                    "glProgramUniform4ui(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3])"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                    ,0x5eb);
                    dVar8 = ::deGetFalse();
                  } while (dVar8 != 0);
                }
              }
            }
            else {
              pvVar12 = std::
                        vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                        ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                      *)local_230,0);
              bVar5 = glu::isDataTypeSampler(pvVar12->type);
              if (bVar5) {
                if ((valuesToAssign.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
                  local_7f4 = (str->finalValue).val.floatV[0];
                  do {
                    sVar9 = std::
                            vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                            ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                                    *)local_230);
                    glu::CallLogWrapper::glProgramUniform1iv
                              (&this->super_CallLogWrapper,programGL,location_00,(GLsizei)sVar9,
                               (GLint *)&local_7f4);
                    GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                    glu::checkError(GVar7,
                                    "glProgramUniform1iv(programGL, location, (GLsizei)valuesToAssign.size(), &unit)"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                    ,0x609);
                    dVar8 = ::deGetFalse();
                  } while (dVar8 != 0);
                }
                else {
                  do {
                    glu::CallLogWrapper::glProgramUniform1i
                              (&this->super_CallLogWrapper,programGL,location_00,
                               (str->finalValue).val.intV[0]);
                    GVar7 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
                    glu::checkError(GVar7,
                                    "glProgramUniform1i(programGL, location, uniform.finalValue.val.samplerV.unit)"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramUniformTests.cpp"
                                    ,0x605);
                    dVar8 = ::deGetFalse();
                  } while (dVar8 != 0);
                }
              }
            }
          }
        }
      }
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
      ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::VarValue>_>
                 *)local_230);
    }
    std::__cxx11::string::~string((string *)local_70);
    uniform._4_4_ = uniform._4_4_ + 1;
  } while( true );
}

Assistant:

void UniformCase::assignUniforms (const vector<BasicUniform>& basicUniforms, deUint32 programGL, Random& rnd)
{
	TestLog&				log				= m_testCtx.getLog();
	const bool				transpose		= (m_features & FEATURE_MATRIXMODE_ROWMAJOR) != 0;
	const GLboolean			transposeGL		= transpose ? GL_TRUE : GL_FALSE;
	const glu::DataType		boolApiType		= m_features & FEATURE_BOOLEANAPITYPE_INT	? glu::TYPE_INT
											: m_features & FEATURE_BOOLEANAPITYPE_UINT	? glu::TYPE_UINT
											:											  glu::TYPE_FLOAT;

	for (int unifNdx = 0; unifNdx < (int)basicUniforms.size(); unifNdx++)
	{
		const BasicUniform&		uniform				= basicUniforms[unifNdx];
		const bool				isArrayMember		= uniform.elemNdx >= 0;
		const string			queryName			= m_features & FEATURE_ARRAY_FIRST_ELEM_NAME_NO_INDEX && uniform.elemNdx == 0 ? beforeLast(uniform.name, '[') : uniform.name;
		const int				numValuesToAssign	= !isArrayMember									? 1
													: m_features & FEATURE_ARRAYASSIGN_FULL				? (uniform.elemNdx == 0			? uniform.rootSize	: 0)
													: m_features & FEATURE_ARRAYASSIGN_BLOCKS_OF_TWO	? (uniform.elemNdx % 2 == 0		? 2					: 0)
													: /* Default: assign array elements separately */	  1;

		DE_ASSERT(numValuesToAssign >= 0);
		DE_ASSERT(numValuesToAssign == 1 || isArrayMember);

		if (numValuesToAssign == 0)
		{
			log << TestLog::Message << "// Uniform " << uniform.name << " is covered by another glProgramUniform*v() call to the same array" << TestLog::EndMessage;
			continue;
		}

		const int			location			= glGetUniformLocation(programGL, queryName.c_str());
		const int			typeSize			= glu::getDataTypeScalarSize(uniform.type);
		const bool			assignByValue		= m_features & FEATURE_UNIFORMFUNC_VALUE && !glu::isDataTypeMatrix(uniform.type) && numValuesToAssign == 1;
		vector<VarValue>	valuesToAssign;

		for (int i = 0; i < numValuesToAssign; i++)
		{
			const string	curName = isArrayMember ? beforeLast(uniform.rootName, '[') + "[" + de::toString(uniform.elemNdx+i) + "]" : uniform.name;
			VarValue		unifValue;

			if (isArrayMember)
			{
				const vector<BasicUniform>::const_iterator elemUnif = BasicUniform::findWithName(basicUniforms, curName.c_str());
				if (elemUnif == basicUniforms.end())
					continue;
				unifValue = elemUnif->finalValue;
			}
			else
				unifValue = uniform.finalValue;

			const VarValue apiValue = glu::isDataTypeBoolOrBVec(unifValue.type)	? getRandomBoolRepresentation(unifValue, boolApiType, rnd)
									: glu::isDataTypeSampler(unifValue.type)	? getSamplerUnitValue(unifValue)
									: unifValue;

			valuesToAssign.push_back(glu::isDataTypeMatrix(apiValue.type) && transpose ? getTransposeMatrix(apiValue) : apiValue);

			if (glu::isDataTypeBoolOrBVec(uniform.type))
				log << TestLog::Message << "// Using type " << glu::getDataTypeName(boolApiType) << " to set boolean value " << apiVarValueStr(unifValue) << " for " << curName << TestLog::EndMessage;
			else if (glu::isDataTypeSampler(uniform.type))
				log << TestLog::Message << "// Texture for the sampler uniform " << curName << " will be filled with color " << apiVarValueStr(getSamplerFillValue(uniform.finalValue)) << TestLog::EndMessage;
		}

		DE_ASSERT(!valuesToAssign.empty());

		if (glu::isDataTypeFloatOrVec(valuesToAssign[0].type))
		{
			if (assignByValue)
			{
				const float* const ptr = &valuesToAssign[0].val.floatV[0];

				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1f(programGL, location, ptr[0]));							break;
					case 2: GLU_CHECK_CALL(glProgramUniform2f(programGL, location, ptr[0], ptr[1]));					break;
					case 3: GLU_CHECK_CALL(glProgramUniform3f(programGL, location, ptr[0], ptr[1], ptr[2]));			break;
					case 4: GLU_CHECK_CALL(glProgramUniform4f(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3]));	break;
					default:
						DE_ASSERT(false);
				}
			}
			else
			{
				vector<float> buffer(valuesToAssign.size() * typeSize);
				for (int i = 0; i < (int)buffer.size(); i++)
					buffer[i] = valuesToAssign[i / typeSize].val.floatV[i % typeSize];

				DE_STATIC_ASSERT(sizeof(GLfloat) == sizeof(buffer[0]));
				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 2: GLU_CHECK_CALL(glProgramUniform2fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 3: GLU_CHECK_CALL(glProgramUniform3fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 4: GLU_CHECK_CALL(glProgramUniform4fv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					default:
						DE_ASSERT(false);
				}
			}
		}
		else if (glu::isDataTypeMatrix(valuesToAssign[0].type))
		{
			DE_ASSERT(!assignByValue);

			vector<float> buffer(valuesToAssign.size() * typeSize);
			for (int i = 0; i < (int)buffer.size(); i++)
				buffer[i] = valuesToAssign[i / typeSize].val.floatV[i % typeSize];

			DE_STATIC_ASSERT(sizeof(GLfloat) == sizeof(buffer[0]));
			switch (uniform.type)
			{
				case glu::TYPE_FLOAT_MAT2:		GLU_CHECK_CALL(glProgramUniformMatrix2fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT3:		GLU_CHECK_CALL(glProgramUniformMatrix3fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT4:		GLU_CHECK_CALL(glProgramUniformMatrix4fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT2X3:	GLU_CHECK_CALL(glProgramUniformMatrix2x3fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT2X4:	GLU_CHECK_CALL(glProgramUniformMatrix2x4fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT3X2:	GLU_CHECK_CALL(glProgramUniformMatrix3x2fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT3X4:	GLU_CHECK_CALL(glProgramUniformMatrix3x4fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT4X2:	GLU_CHECK_CALL(glProgramUniformMatrix4x2fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				case glu::TYPE_FLOAT_MAT4X3:	GLU_CHECK_CALL(glProgramUniformMatrix4x3fv	(programGL, location, (GLsizei)valuesToAssign.size(), transposeGL, &buffer[0])); break;
				default:
					DE_ASSERT(false);
			}
		}
		else if (glu::isDataTypeIntOrIVec(valuesToAssign[0].type))
		{
			if (assignByValue)
			{
				const deInt32* const ptr = &valuesToAssign[0].val.intV[0];

				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1i(programGL, location, ptr[0]));							break;
					case 2: GLU_CHECK_CALL(glProgramUniform2i(programGL, location, ptr[0], ptr[1]));					break;
					case 3: GLU_CHECK_CALL(glProgramUniform3i(programGL, location, ptr[0], ptr[1], ptr[2]));			break;
					case 4: GLU_CHECK_CALL(glProgramUniform4i(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3]));	break;
					default:
						DE_ASSERT(false);
				}
			}
			else
			{
				vector<deInt32> buffer(valuesToAssign.size() * typeSize);
				for (int i = 0; i < (int)buffer.size(); i++)
					buffer[i] = valuesToAssign[i / typeSize].val.intV[i % typeSize];

				DE_STATIC_ASSERT(sizeof(GLint) == sizeof(buffer[0]));
				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 2: GLU_CHECK_CALL(glProgramUniform2iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 3: GLU_CHECK_CALL(glProgramUniform3iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 4: GLU_CHECK_CALL(glProgramUniform4iv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					default:
						DE_ASSERT(false);
				}
			}
		}
		else if (glu::isDataTypeUintOrUVec(valuesToAssign[0].type))
		{
			if (assignByValue)
			{
				const deUint32* const ptr = &valuesToAssign[0].val.uintV[0];

				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1ui(programGL, location, ptr[0]));							break;
					case 2: GLU_CHECK_CALL(glProgramUniform2ui(programGL, location, ptr[0], ptr[1]));					break;
					case 3: GLU_CHECK_CALL(glProgramUniform3ui(programGL, location, ptr[0], ptr[1], ptr[2]));			break;
					case 4: GLU_CHECK_CALL(glProgramUniform4ui(programGL, location, ptr[0], ptr[1], ptr[2], ptr[3]));	break;
					default:
						DE_ASSERT(false);
				}
			}
			else
			{
				vector<deUint32> buffer(valuesToAssign.size() * typeSize);
				for (int i = 0; i < (int)buffer.size(); i++)
					buffer[i] = valuesToAssign[i / typeSize].val.intV[i % typeSize];

				DE_STATIC_ASSERT(sizeof(GLuint) == sizeof(buffer[0]));
				switch (typeSize)
				{
					case 1: GLU_CHECK_CALL(glProgramUniform1uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 2: GLU_CHECK_CALL(glProgramUniform2uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 3: GLU_CHECK_CALL(glProgramUniform3uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					case 4: GLU_CHECK_CALL(glProgramUniform4uiv(programGL, location, (GLsizei)valuesToAssign.size(), &buffer[0])); break;
					default:
						DE_ASSERT(false);
				}
			}
		}
		else if (glu::isDataTypeSampler(valuesToAssign[0].type))
		{
			if (assignByValue)
				GLU_CHECK_CALL(glProgramUniform1i(programGL, location, uniform.finalValue.val.samplerV.unit));
			else
			{
				const GLint unit = uniform.finalValue.val.samplerV.unit;
				GLU_CHECK_CALL(glProgramUniform1iv(programGL, location, (GLsizei)valuesToAssign.size(), &unit));
			}
		}
		else
			DE_ASSERT(false);
	}
}